

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O2

void test_bson_oid_copy(void)

{
  char cVar1;
  bson_oid_t oid2;
  bson_oid_t oid;
  undefined1 auStack_28 [12];
  undefined1 local_1c [12];
  
  bson_oid_init_from_string(local_1c,"000000000000000000001234");
  bson_oid_init_from_string(auStack_28,"000000000000000000004321");
  bson_oid_copy(local_1c,auStack_28);
  cVar1 = bson_oid_equal(local_1c,auStack_28);
  if (cVar1 != '\0') {
    return;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-oid.c",
          0xb1,"test_bson_oid_copy","true == bson_oid_equal (&oid, &oid2)");
  abort();
}

Assistant:

static void
test_bson_oid_copy (void)
{
   bson_oid_t oid;
   bson_oid_t oid2;

   bson_oid_init_from_string (&oid, "000000000000000000001234");
   bson_oid_init_from_string (&oid2, "000000000000000000004321");
   bson_oid_copy (&oid, &oid2);
   BSON_ASSERT (true == bson_oid_equal (&oid, &oid2));
}